

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

int __thiscall
opengv::absolute_pose::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  PointerType ptr;
  Indices *pIVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  Matrix<double,_4,_1,_0,_4,_1> p_hom;
  translation_t translation;
  cayley_t cayley;
  rotation_t rotation;
  double local_220;
  double dStack_218;
  double local_150;
  double dStack_148;
  double local_140;
  double dStack_138;
  double dStack_130;
  undefined8 local_128;
  double local_120;
  double dStack_118;
  double local_110;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  double local_d0;
  cayley_t local_c0;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  double local_60;
  
  pdVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  dVar10 = *pdVar3;
  dVar11 = pdVar3[1];
  dVar1 = *pdVar3;
  dVar2 = pdVar3[2];
  local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       pdVar3[3];
  local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar3[4];
  local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar3[5];
  math::cayley2rot(&local_c0);
  auVar4._8_8_ = uStack_98;
  auVar4._0_8_ = local_a0;
  pIVar15 = this->_indices;
  local_f0 = vpinsrq_avx(auVar4,uStack_88,1);
  auVar21._8_8_ = local_90;
  auVar21._0_8_ = uStack_98;
  local_100 = vpinsrq_avx(auVar21,local_80,1);
  auVar22._8_8_ = uStack_88;
  auVar22._0_8_ = local_90;
  auVar4 = vpinsrq_avx(auVar22,local_78,1);
  auVar23._0_8_ = local_f0._0_8_ * dVar1;
  auVar23._8_8_ = local_f0._8_8_ * dVar1;
  auVar20._8_8_ = dVar11;
  auVar20._0_8_ = dVar11;
  auVar20 = vfnmsub231pd_avx512vl(auVar23,local_100,auVar20);
  auVar24._8_8_ = dVar2;
  auVar24._0_8_ = dVar2;
  if (pIVar15->_numberCorrespondences != 0) {
    lVar19 = 0;
    uVar18 = 0;
    auVar20 = vfnmadd231pd_fma(auVar20,auVar24,auVar4);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_60;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar21 = vxorpd_avx512vl(auVar12,auVar5);
    do {
      iVar17 = (int)uVar18;
      lVar16 = lVar19 >> 0x1e;
      iVar14 = iVar17;
      if (pIVar15->_useIndices != false) {
        iVar14 = *(int *)((long)(pIVar15->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar16);
      }
      (*this->_adapter->_vptr_AbsoluteAdapterBase[6])(&local_150,this->_adapter,(long)iVar14);
      dVar26 = local_140;
      dVar1 = local_150;
      auVar6._8_8_ = local_150;
      auVar6._0_8_ = local_150;
      auVar22 = vmulpd_avx512vl(local_f0,auVar6);
      auVar7._8_8_ = dStack_148;
      auVar7._0_8_ = dStack_148;
      auVar22 = vfmadd231pd_avx512vl(auVar22,local_100,auVar7);
      auVar8._8_8_ = local_140;
      auVar8._0_8_ = local_140;
      auVar22 = vfmadd231pd_avx512vl(auVar22,auVar4,auVar8);
      auVar9._8_8_ = 0x3ff0000000000000;
      auVar9._0_8_ = 0x3ff0000000000000;
      auVar22 = vfmadd231pd_avx512vl(auVar22,auVar20,auVar9);
      iVar14 = iVar17;
      if (this->_indices->_useIndices != false) {
        iVar14 = *(int *)((long)(this->_indices->_indices->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar16);
      }
      dVar28 = local_68 * dStack_148;
      (*this->_adapter->_vptr_AbsoluteAdapterBase[5])(&local_150,this->_adapter,(long)iVar14);
      iVar14 = iVar17;
      if (this->_indices->_useIndices != false) {
        iVar14 = *(int *)((long)(this->_indices->_indices->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar16);
      }
      (*this->_adapter->_vptr_AbsoluteAdapterBase[4])(local_e0,this->_adapter,(long)iVar14);
      auVar13._8_8_ = dStack_138;
      auVar13._0_8_ = local_140;
      auVar23 = vsubpd_avx(auVar22,local_e0);
      auVar22 = vmovhpd_avx(auVar13,local_128);
      dVar1 = (dVar1 * local_70 + dVar28 +
              dVar26 * local_60 + ((dVar2 * auVar21._0_8_ - local_68 * dVar11) - dVar10 * local_70))
              - local_d0;
      dVar26 = auVar23._0_8_;
      dVar28 = auVar23._8_8_;
      if (this->_indices->_useIndices != false) {
        iVar17 = *(int *)((long)(this->_indices->_indices->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar16);
      }
      auVar25._0_8_ = dVar1 * auVar22._0_8_ + dVar26 * local_150 + dVar28 * dStack_148;
      auVar25._8_8_ = dVar1 * auVar22._8_8_ + dVar26 * dStack_138 + dVar28 * dStack_130;
      dVar1 = dVar1 * local_110 + dVar26 * local_120 + dVar28 * dStack_118;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar1 * dVar1 + auVar25._0_8_ * auVar25._0_8_ + auVar25._8_8_ * auVar25._8_8_;
      auVar22 = vsqrtpd_avx(auVar27);
      dVar26 = auVar22._0_8_;
      auVar29._8_8_ = dVar26;
      auVar29._0_8_ = dVar26;
      auVar22 = vdivpd_avx(auVar25,auVar29);
      (*this->_adapter->_vptr_AbsoluteAdapterBase[2])(&local_150,this->_adapter,(long)iVar17);
      local_220 = auVar22._0_8_;
      dStack_218 = auVar22._8_8_;
      lVar19 = lVar19 + 0x100000000;
      (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [uVar18] = 1.0 - (local_220 * local_150 + dStack_218 * dStack_148 +
                       (dVar1 / dVar26) * local_140);
      uVar18 = uVar18 + 1;
      pIVar15 = this->_indices;
    } while (uVar18 < pIVar15->_numberCorrespondences);
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    translation_t translation = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    rotation_t rotation = math::cayley2rot(cayley);

    //compute inverse transformation
    transformation_t inverseSolution;
    inverseSolution.block<3,3>(0,0) = rotation.transpose();
    inverseSolution.col(3) = -inverseSolution.block<3,3>(0,0)*translation;

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for(size_t i = 0; i < _indices.size(); i++)
    {
      //get point in homogeneous form
      p_hom.block<3,1>(0,0) = _adapter.getPoint(_indices[i]);

      //compute the reprojection (this is working for both central and
      //non-central case)
      point_t bodyReprojection = inverseSolution * p_hom;
      point_t reprojection = _adapter.getCamRotation(_indices[i]).transpose() *
          (bodyReprojection - _adapter.getCamOffset(_indices[i]));
      reprojection = reprojection / reprojection.norm();

      //compute the score
      double factor = 1.0;
      fvec[i] = factor *
          (1.0 -
          (reprojection.transpose() * _adapter.getBearingVector(_indices[i])));
    }

    return 0;
  }